

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O2

Class * __thiscall camp::UserObject::getClass(UserObject *this)

{
  NullObject *__return_storage_ptr__;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  NullObject local_60;
  
  if (this->m_class != (Class *)0x0) {
    return this->m_class;
  }
  __return_storage_ptr__ = (NullObject *)__cxa_allocate_exception(0x48);
  NullObject::NullObject(&local_60,this->m_class);
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/userobject.cpp"
             ,&local_a1);
  std::__cxx11::string::string
            ((string *)&local_a0,"const Class &camp::UserObject::getClass() const",&local_a2);
  Error::prepare<camp::NullObject>(__return_storage_ptr__,&local_60,&local_80,100,&local_a0);
  __cxa_throw(__return_storage_ptr__,&NullObject::typeinfo,Error::~Error);
}

Assistant:

const Class& UserObject::getClass() const
{
    if (m_class)
    {
        return *m_class;
    }
    else
    {
        CAMP_ERROR(NullObject(m_class));
    }
}